

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::Command::UpdateSubparserHelp(Command *this,HelpParams *params)

{
  Subparser *this_00;
  RaiiSubparser coro;
  RaiiSubparser local_d8;
  
  if ((this->parserCoroutine).super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &local_d8.parser;
    local_d8.command = this;
    Subparser::Subparser(this_00,this,params);
    local_d8.oldSubparser = (local_d8.command)->subparser;
    (local_d8.command)->subparser = this_00;
    if ((this->parserCoroutine).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->parserCoroutine)._M_invoker)((_Any_data *)&this->parserCoroutine,this_00);
    RaiiSubparser::~RaiiSubparser(&local_d8);
  }
  return;
}

Assistant:

Error(const std::string &problem) : std::runtime_error(problem) {}